

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  uint uVar4;
  size_t argumentCount_00;
  ulong uVar5;
  ulong *function;
  sysbvm_bitflags_t applicationFlags;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  bool bVar8;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t *local_1b8;
  sysbvm_tuple_t *psStack_1b0;
  sysbvm_tuple_t local_1a8;
  ulong *puStack_1a0;
  sysbvm_tuple_t local_198;
  ulong *puStack_190;
  sysbvm_tuple_t *local_188;
  sysbvm_tuple_t sStack_180;
  sysbvm_tuple_t local_178;
  sysbvm_tuple_t sStack_170;
  sysbvm_tuple_t *local_168;
  sysbvm_tuple_t sStack_160;
  sysbvm_tuple_t local_158;
  sysbvm_tuple_t sStack_150;
  sysbvm_tuple_t local_148;
  sysbvm_tuple_t sStack_140;
  sysbvm_stackFrameRecord_t local_130;
  undefined8 local_120;
  sysbvm_stackFrameRecord_t local_118;
  undefined8 local_108;
  undefined1 *puStack_100;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_e0;
  sysbvm_functionCallFrameStack_t local_d8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_148 = 0;
  sStack_140 = 0;
  local_158 = 0;
  sStack_150 = 0;
  local_168 = (sysbvm_tuple_t *)0x0;
  sStack_160 = 0;
  local_178 = 0;
  sStack_170 = 0;
  local_188 = (sysbvm_tuple_t *)0x0;
  sStack_180 = 0;
  local_198 = 0;
  puStack_190 = (ulong *)0x0;
  local_1a8 = 0;
  puStack_1a0 = (ulong *)0x0;
  local_1b8 = (sysbvm_tuple_t *)0x0;
  psStack_1b0 = (sysbvm_tuple_t *)0x0;
  local_118.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_118._12_4_ = 0;
  local_108 = 0x10;
  puStack_100 = (undefined1 *)&local_1b8;
  sysbvm_stackFrame_pushRecord(&local_118);
  local_130.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_130.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_120 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_130);
  sVar3 = *(sysbvm_tuple_t *)(*arguments + 0x28);
  if (sVar3 != 0) {
    local_1b8 = (sysbvm_tuple_t *)
                sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar3,arguments[1]);
    if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
      uVar5 = (ulong)local_1b8 & 0xf;
      if (uVar5 == 0 && local_1b8 != (sysbvm_tuple_t *)0x0) {
        psStack_1b0 = (sysbvm_tuple_t *)*local_1b8;
      }
      else if ((int)uVar5 == 0xf) {
        psStack_1b0 = (sysbvm_tuple_t *)
                      sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_1b8 >> 4);
      }
      else {
        psStack_1b0 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
      }
    }
    else {
      psStack_1b0 = (sysbvm_tuple_t *)
                    sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                              (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    }
    uVar5 = (ulong)psStack_1b0 & 0xf;
    if (uVar5 == 0 && psStack_1b0 != (sysbvm_tuple_t *)0x0) {
      sVar6 = *psStack_1b0;
    }
    else if ((int)uVar5 == 0xf) {
      sVar6 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_1b0 >> 4);
    }
    else {
      sVar6 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
    }
    puStack_190 = (ulong *)sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction
                                     (context,sVar6);
    if (puStack_190 == (ulong *)0x0) {
      local_1a8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                            (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
      puStack_1a0 = (ulong *)sysbvm_type_lookupMacroSelector
                                       (context,(sysbvm_tuple_t)psStack_1b0,local_1a8);
      if (puStack_1a0 == (ulong *)0x0) {
        puStack_1a0 = (ulong *)sysbvm_type_lookupSelector
                                         (context,(sysbvm_tuple_t)psStack_1b0,local_1a8);
      }
      if (puStack_1a0 == (ulong *)0x0) {
        puStack_1a0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                         (context,(sysbvm_tuple_t)psStack_1b0,local_1a8);
      }
      if (puStack_1a0 != (ulong *)0x0) goto LAB_0011cd1e;
      uVar5 = *(ulong *)(*arguments + 0x40);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        sVar3 = (sysbvm_tuple_t)(*(uint *)(uVar5 + 0xc) >> 3);
      }
      else {
        sVar3 = 0;
      }
      puStack_1a0 = (ulong *)sysbvm_type_lookupMacroSelector
                                       (context,(sysbvm_tuple_t)psStack_1b0,
                                        (context->roots).doesNotUnderstandSelector);
      if (puStack_1a0 == (ulong *)0x0) {
        puStack_1a0 = (ulong *)sysbvm_type_lookupSelector
                                         (context,(sysbvm_tuple_t)psStack_1b0,
                                          (context->roots).doesNotUnderstandSelector);
      }
      if (puStack_1a0 == (ulong *)0x0) {
        puStack_1a0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                         (context,(sysbvm_tuple_t)psStack_1b0,
                                          (context->roots).doesNotUnderstandSelector);
      }
      if (puStack_1a0 == (ulong *)0x0) {
        sysbvm_error("Message not understood.");
      }
      if (((ulong)puStack_1a0 & 0xf) == 0 && puStack_1a0 != (ulong *)0x0) {
        uVar5 = *puStack_1a0;
        if (((uVar5 & 0xf) == 0 && uVar5 != 0) && ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
          uVar5 = *(ulong *)(uVar5 + 0x70);
          if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
            uVar4 = (uint)((long)uVar5 >> 4);
          }
          else {
            uVar4 = (uint)*(undefined8 *)(uVar5 + 0x10);
          }
        }
        else {
          uVar4 = 0;
        }
        if ((uVar4 >> 0xc & 1) == 0) goto LAB_0011d11a;
        uVar5 = puStack_1a0[5];
        if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
          uVar5 = (long)uVar5 >> 4;
        }
        else {
          uVar5 = *(ulong *)(uVar5 + 0x10);
        }
      }
      else {
LAB_0011d11a:
        uVar5 = 0;
      }
      if ((uVar5 & 1) != 0) {
        local_188 = (sysbvm_tuple_t *)
                    sysbvm_macroContext_create
                              (context,*arguments,*(sysbvm_tuple_t *)(*arguments + 0x10),
                               arguments[1]);
        local_168 = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
        uVar5 = *(ulong *)(*arguments + 0x28);
        if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
          sVar3 = *(sysbvm_tuple_t *)(uVar5 + 0x10);
        }
        else {
          sVar3 = 0;
        }
        local_178 = sysbvm_astLiteralNode_create(context,sVar3,(sysbvm_tuple_t)local_1b8);
        local_168[5] = local_178;
        uVar5 = *(ulong *)(*arguments + 0x38);
        if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
          sVar3 = *(sysbvm_tuple_t *)(uVar5 + 0x10);
        }
        else {
          sVar3 = 0;
        }
        sStack_170 = sysbvm_astLiteralNode_create(context,sVar3,local_1a8);
        local_168[7] = sStack_170;
        local_d8.applicationFlags = (sysbvm_bitflags_t)local_188;
        local_d8.isVariadic = (_Bool)(undefined1)local_178;
        local_d8.isMemoizedTemplate = (_Bool)local_178._1_1_;
        local_d8._10_6_ = local_178._2_6_;
        local_d8.expectedArgumentCount = (size_t)local_168;
        sStack_180 = sysbvm_function_apply
                               (context,(sysbvm_tuple_t)puStack_1a0,3,&local_d8.applicationFlags,0);
        goto LAB_0011d005;
      }
      sStack_160 = sysbvm_array_create(context,sVar3);
      if (sVar3 != 0) {
        sVar6 = 0;
        do {
          uVar5 = *(ulong *)(*arguments + 0x40);
          if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
            local_158 = *(sysbvm_tuple_t *)(uVar5 + 0x10 + sVar6 * 8);
          }
          else {
            local_158 = 0;
          }
          sStack_150 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                 (context,local_158,arguments[1]);
          if ((sStack_150 & 0xf) == 0 && sStack_150 != 0) {
            *(sysbvm_tuple_t *)(sStack_150 + 0x10 + sVar6 * 8) = sStack_150;
          }
          sVar6 = sVar6 + 1;
        } while (sVar3 != sVar6);
      }
      local_148 = sysbvm_message_create
                            (context,local_1a8,sStack_160,(sysbvm_tuple_t)psStack_1b0,
                             *(sysbvm_tuple_t *)(*arguments + 0x10));
      local_d8.applicationFlags = (sysbvm_bitflags_t)local_1b8;
      argumentCount_00 = 2;
      applicationFlags = 1;
      function = puStack_1a0;
      local_d8._8_8_ = local_148;
    }
    else {
      local_d8._8_8_ = *arguments;
      local_d8.applicationFlags = (sysbvm_bitflags_t)psStack_1b0;
      local_d8.expectedArgumentCount = (size_t)local_1b8;
      argumentCount_00 = 4;
      applicationFlags = 0;
      function = puStack_190;
      local_d8.variadicArgumentIndex = arguments[1];
    }
    sStack_140 = sysbvm_function_apply
                           (context,(sysbvm_tuple_t)function,argumentCount_00,
                            &local_d8.applicationFlags,applicationFlags);
    goto LAB_0011cec7;
  }
  local_1a8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                        (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
  _Var2 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],local_1a8,&local_198);
  if ((!_Var2) || (_Var2 = sysbvm_symbolBinding_isValue(context,local_198), !_Var2)) {
    sysbvm_error("Failed to find symbol for message send without receiver.");
  }
  if (((local_198 & 0xf) == 0 && local_198 != 0) && (0x57 < *(uint *)(local_198 + 0xc))) {
    puStack_1a0 = *(ulong **)(local_198 + 0x38);
  }
  else {
    puStack_1a0 = (ulong *)0x0;
  }
LAB_0011cd1e:
  if (((ulong)puStack_1a0 & 0xf) == 0 && puStack_1a0 != (ulong *)0x0) {
    uVar5 = *puStack_1a0;
    if (((uVar5 & 0xf) == 0 && uVar5 != 0) && ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
      uVar5 = *(ulong *)(uVar5 + 0x70);
      if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
        uVar4 = (uint)((long)uVar5 >> 4);
      }
      else {
        uVar4 = (uint)*(undefined8 *)(uVar5 + 0x10);
      }
    }
    else {
      uVar4 = 0;
    }
    if ((uVar4 >> 0xc & 1) == 0) goto LAB_0011cd75;
    uVar5 = puStack_1a0[5];
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      uVar5 = (long)uVar5 >> 4;
    }
    else {
      uVar5 = *(ulong *)(uVar5 + 0x10);
    }
  }
  else {
LAB_0011cd75:
    uVar5 = 0;
  }
  memset(&local_d8,0,0xb0);
  local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_f8._12_4_ = 0;
  local_e8 = 0x11;
  paStack_e0 = &local_d8.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_f8);
  uVar7 = *(ulong *)(*arguments + 0x40);
  bVar8 = (uVar7 & 0xf) != 0;
  if ((uVar5 & 1) != 0) {
    if (bVar8 || uVar7 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(*(uint *)(uVar7 + 0xc) >> 3);
    }
    sysbvm_functionCallFrameStack_begin
              (context,&local_d8,(sysbvm_tuple_t)puStack_1a0,(ulong)(sVar3 != 0) + 1 + uVar5,0);
    local_188 = (sysbvm_tuple_t *)
                sysbvm_macroContext_create
                          (context,*arguments,*(sysbvm_tuple_t *)(*arguments + 0x10),arguments[1]);
    sysbvm_functionCallFrameStack_push(&local_d8,(sysbvm_tuple_t)local_188);
    if (sVar3 != 0) {
      uVar7 = *(ulong *)(*arguments + 0x28);
      if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
        sVar3 = *(sysbvm_tuple_t *)(uVar7 + 0x10);
      }
      else {
        sVar3 = 0;
      }
      local_178 = sysbvm_astLiteralNode_create(context,sVar3,(sysbvm_tuple_t)local_1b8);
      sysbvm_functionCallFrameStack_push(&local_d8,local_178);
    }
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        uVar1 = *(ulong *)(*arguments + 0x40);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          sVar3 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
        }
        else {
          sVar3 = 0;
        }
        sysbvm_functionCallFrameStack_push(&local_d8,sVar3);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    sysbvm_stackFrame_popRecord(&local_f8);
    sStack_180 = sysbvm_functionCallFrameStack_finish(context,&local_d8);
LAB_0011d005:
    sysbvm_stackFrame_popRecord(&local_130);
    sysbvm_stackFrame_popRecord(&local_118);
    sVar3 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sStack_180,arguments[1])
    ;
    return sVar3;
  }
  if (bVar8 || uVar7 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(uVar7 + 0xc) >> 3);
  }
  sysbvm_functionCallFrameStack_begin
            (context,&local_d8,(sysbvm_tuple_t)puStack_1a0,(sVar3 != 0) + uVar5,0);
  if (sVar3 != 0) {
    sysbvm_functionCallFrameStack_push(&local_d8,(sysbvm_tuple_t)local_1b8);
  }
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      uVar1 = *(ulong *)(*arguments + 0x40);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_158 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
      }
      else {
        local_158 = 0;
      }
      sStack_150 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                             (context,local_158,arguments[1]);
      sysbvm_functionCallFrameStack_push(&local_d8,sStack_150);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  sysbvm_stackFrame_popRecord(&local_f8);
  sStack_140 = sysbvm_functionCallFrameStack_finish(context,&local_d8);
LAB_0011cec7:
  sysbvm_stackFrame_popRecord(&local_130);
  sysbvm_stackFrame_popRecord(&local_118);
  return sStack_140;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodBinding;

        sysbvm_tuple_t analysisAndEvaluationFunction;
        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t receiverLiteralNode;
        sysbvm_tuple_t selectorLiteralNode;
        sysbvm_astMessageSendNode_t *messageNode;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t message;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sendNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*sendNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiver, *environment);
        hasReceiver = true;

        if((*sendNode)->receiverLookupType)
            gcFrame.receiverType = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiverLookupType, *environment);
        else
            gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.analysisAndEvaluationFunction = sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.receiverType));
        if(gcFrame.analysisAndEvaluationFunction)
        {
            gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisAndEvaluationFunction, gcFrame.receiverType, *node, gcFrame.receiver, *environment);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }

        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
            gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            // Does not understand: 
            if(sysbvm_function_isMacro(context, gcFrame.method))
            {
                gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
                gcFrame.messageNode = (sysbvm_astMessageSendNode_t *)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*sendNode);

                gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
                gcFrame.messageNode->receiver = gcFrame.receiverLiteralNode;

                gcFrame.selectorLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->selector), gcFrame.selector);
                gcFrame.messageNode->selector = gcFrame.selectorLiteralNode;

                gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.receiverLiteralNode, (sysbvm_tuple_t)gcFrame.messageNode);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

                // Analyze and evaluate the resulting node.
                return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
            }
            else
            {
                gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
                for(size_t i = 0; i < applicationArgumentCount; ++i)
                {
                    gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
                    gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                    sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
                }

                gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, (*sendNode)->super.sourcePosition);
                gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.method, gcFrame.receiver, gcFrame.message);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }
        }
    }
    else
    {
        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.method);
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    if(isMacro)
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, 1 + applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.macroContext);

        // We need to push the receiver as a node, so wrap it in a literal node here.
        if(hasReceiver)
        {
            gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiverLiteralNode);
        }

        // Push the argument nodes.
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at((*sendNode)->arguments, i));

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.expansionResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }
    else
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        if(hasReceiver)
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiver);

        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
            gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
        }

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
}